

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuThreadUtil.hpp
# Opt level: O0

MessageBuilder * __thiscall
tcu::ThreadUtil::MessageBuilder::operator<<(MessageBuilder *this,char **t)

{
  char **t_local;
  MessageBuilder *this_local;
  
  std::operator<<((ostream *)&this->field_0x18,*t);
  return this;
}

Assistant:

MessageBuilder&		operator<<			(const T& t) { m_stream << t; return *this; }